

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

uint8 * __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
::InternalSerializeWithCachedSizesToArray
          (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
           *this,bool deterministic,uint8 *output)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  uint8 *puVar3;
  undefined4 extraout_var_00;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  undefined7 in_register_00000031;
  
  iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])
                    (this,CONCAT71(in_register_00000031,deterministic));
  *output = '\n';
  puVar3 = io::CodedOutputStream::WriteStringWithSizeToArray
                     ((string *)CONCAT44(extraout_var,iVar2),output + 1);
  iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0x12])(this);
  uVar4 = *(ulong *)CONCAT44(extraout_var_00,iVar2);
  *puVar3 = '\x10';
  pbVar6 = puVar3 + 1;
  uVar5 = uVar4;
  if (0x7f < uVar4) {
    do {
      *pbVar6 = (byte)uVar4 | 0x80;
      uVar5 = uVar4 >> 7;
      pbVar6 = pbVar6 + 1;
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar5;
    } while (bVar1);
  }
  *pbVar6 = (byte)uVar5;
  return pbVar6 + 1;
}

Assistant:

::google::protobuf::uint8* InternalSerializeWithCachedSizesToArray(bool deterministic,
                                                   ::google::protobuf::uint8* output) const {
    output = KeyTypeHandler::InternalWriteToArray(kKeyFieldNumber, key(),
                                                  deterministic, output);
    output = ValueTypeHandler::InternalWriteToArray(kValueFieldNumber, value(),
                                                    deterministic, output);
    return output;
  }